

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O0

Type * parse_type_name(Translation_Data *translation_data,Scope *scope)

{
  Denotation_Prototype *prototype_00;
  Type *pTVar1;
  Type *ret;
  Denotation_Prototype *prototype;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  prototype_00 = parse_specifier_qualifier_list(translation_data,scope);
  pTVar1 = parse_abstract_declarator(translation_data,scope,prototype_00);
  delete_denoted_prototype(prototype_00);
  return pTVar1;
}

Assistant:

struct Type* parse_type_name(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct Denotation_Prototype *prototype;
	struct Type *ret;
	prototype=parse_specifier_qualifier_list(translation_data,scope);
	ret=parse_abstract_declarator(translation_data,scope,prototype);
	delete_denoted_prototype(prototype);
	return ret;
}